

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

PipelineResourceSignatureInternalDataType * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetInternalData
          (PipelineResourceSignatureInternalDataType *__return_storage_ptr__,
          PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this)

{
  PipelineResourceSignatureInternalDataType *InternalData;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  PipelineResourceSignatureInternalDataVk::PipelineResourceSignatureInternalDataVk
            (__return_storage_ptr__);
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).ShaderStages = this->m_ShaderStages;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).StaticResShaderStages = this->m_StaticResShaderStages;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).PipelineType = this->m_PipelineType;
  *(undefined4 *)
   (__return_storage_ptr__->
   super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
   ).StaticResStageIndex._M_elems = *(undefined4 *)(this->m_StaticResStageIndex)._M_elems;
  *(undefined2 *)
   ((__return_storage_ptr__->
    super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
    ).StaticResStageIndex._M_elems + 4) =
       *(undefined2 *)((this->m_StaticResStageIndex)._M_elems + 4);
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).pResourceAttribs = this->m_pResourceAttribs;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).NumResources =
       (this->
       super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
       ).m_Desc.NumResources;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).pImmutableSamplers = this->m_pImmutableSamplerAttribs;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).NumImmutableSamplers =
       (this->
       super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
       ).m_Desc.NumImmutableSamplers;
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureInternalDataType GetInternalData() const
    {
        PipelineResourceSignatureInternalDataType InternalData;

        InternalData.ShaderStages          = m_ShaderStages;
        InternalData.StaticResShaderStages = m_StaticResShaderStages;
        InternalData.PipelineType          = m_PipelineType;
        InternalData.StaticResStageIndex   = m_StaticResStageIndex;

        InternalData.pResourceAttribs     = m_pResourceAttribs;
        InternalData.NumResources         = this->m_Desc.NumResources;
        InternalData.pImmutableSamplers   = m_pImmutableSamplerAttribs;
        InternalData.NumImmutableSamplers = this->m_Desc.NumImmutableSamplers;

        return InternalData;
    }